

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioNotifyOpenWithSize(int bufSize)

{
  int __fd;
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint16_t *puVar5;
  int slot;
  char *__format;
  FILE *pFVar6;
  int iVar7;
  char name [32];
  
  pFVar6 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar6,"%s %s: bufSize=%d\n",myTimeStamp::buf,"gpioNotifyOpenWithSize",bufSize);
  }
  pFVar6 = _stderr;
  if (libInitialised == '\0') {
    iVar7 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    __format = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)notifyMutex_mutex);
    puVar5 = &gpioNotify[0].state;
    uVar4 = 0xffffffffffffffff;
    iVar7 = 0x20;
    for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
      if (*puVar5 == 0) {
        *puVar5 = 1;
        iVar7 = (int)uVar3;
        uVar4 = uVar3 & 0xffffffff;
        break;
      }
      puVar5 = puVar5 + 0xe;
    }
    pthread_mutex_unlock((pthread_mutex_t *)notifyMutex_mutex);
    pFVar6 = _stderr;
    slot = (int)uVar4;
    if (-1 < slot) {
      sprintf(name,"/dev/pigpio%d",uVar4 & 0xffffffff);
      myCreatePipe(name,0x1b4);
      __fd = open(name,0x802);
      if (__fd < 0) {
        gpioNotify[uVar4 & 0xffffffff].state = 0;
        pFVar6 = _stderr;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x17;
        }
        myTimeStamp();
        fprintf(pFVar6,"%s %s: open %s failed (%m)\n",myTimeStamp::buf,"gpioNotifyOpenWithSize",name
               );
        return -0x17;
      }
      if ((bufSize != 0) && (iVar1 = fcntl(__fd,0x407,bufSize), iVar7 = bufSize, iVar1 != bufSize))
      {
        gpioNotify[uVar4 & 0xffffffff].state = 0;
        pFVar6 = _stderr;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x17;
        }
        myTimeStamp();
        fprintf(pFVar6,"%s %s: fcntl %s size %d failed (%m)\n",myTimeStamp::buf,
                "gpioNotifyOpenWithSize",name,bufSize);
        return -0x17;
      }
      uVar4 = uVar4 & 0xffffffff;
      gpioNotify[uVar4].seqno = 0;
      gpioNotify[uVar4].bits = 0;
      gpioNotify[uVar4].fd = __fd;
      gpioNotify[uVar4].pipe = 1;
      gpioNotify[uVar4].max_emits = 0x155;
      uVar2 = gpioTick();
      gpioNotify[uVar4].lastReportTick = uVar2;
      gpioNotify[iVar7].state = 3;
      closeOrphanedNotifications(slot,__fd);
      return slot;
    }
    iVar7 = -0x18;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x18;
    }
    myTimeStamp();
    __format = "%s %s: no handle\n";
  }
  fprintf(pFVar6,__format,myTimeStamp::buf,"gpioNotifyOpenWithSize");
  return iVar7;
}

Assistant:

int gpioNotifyOpenWithSize(int bufSize)
{
   int i, slot, fd;
   char name[32];

   DBG(DBG_USER, "bufSize=%d", bufSize);

   CHECK_INITED;

   slot = -1;

   notifyMutex(1);

   for (i=0; i<PI_NOTIFY_SLOTS; i++)
   {
      if (gpioNotify[i].state == PI_NOTIFY_CLOSED)
      {
         slot = i;
         gpioNotify[slot].state = PI_NOTIFY_RESERVED;
         break;
      }
   }

   notifyMutex(0);

   if (slot < 0) SOFT_ERROR(PI_NO_HANDLE, "no handle");

   sprintf(name, "/dev/pigpio%d", slot);

   myCreatePipe(name, 0664);

   fd = open(name, O_RDWR|O_NONBLOCK);

   if (fd < 0)
   {
      gpioNotify[slot].state = PI_NOTIFY_CLOSED;
      SOFT_ERROR(PI_BAD_PATHNAME, "open %s failed (%m)", name);
   }

   if (bufSize != 0)
   {
      i = fcntl(fd, F_SETPIPE_SZ, bufSize);
      if (i != bufSize)
      {
         gpioNotify[slot].state = PI_NOTIFY_CLOSED;
         SOFT_ERROR(PI_BAD_PATHNAME,
            "fcntl %s size %d failed (%m)", name, bufSize);
      }
   }

   gpioNotify[slot].seqno = 0;
   gpioNotify[slot].bits  = 0;
   gpioNotify[slot].fd    = fd;
   gpioNotify[slot].pipe  = 1;
   gpioNotify[slot].max_emits  = MAX_EMITS;
   gpioNotify[slot].lastReportTick = gpioTick();
   gpioNotify[i].state = PI_NOTIFY_OPENED;

   closeOrphanedNotifications(slot, fd);

   return slot;
}